

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EC_KEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var1;
  LIBSSH2_CRYPT_METHOD *pLVar2;
  _LIBSSH2_MAC_METHOD *p_Var3;
  LIBSSH2_COMP_METHOD *pLVar4;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  BIGNUM *pBVar11;
  uchar *puVar12;
  uchar *puVar13;
  LIBSSH2_HOSTKEY_METHOD *pLVar14;
  char *pcVar15;
  ulong uVar16;
  uchar *puVar17;
  long lVar18;
  EVP_MD_CTX *pEVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  EVP_MD_CTX *ctx;
  EVP_MD_CTX *hash;
  uchar *local_68;
  size_t local_60;
  uchar *server_public_key;
  libssh2_curve_type local_4c;
  size_t local_48;
  size_t server_public_key_len;
  EVP_MD_CTX *local_38;
  
  if (data_len < 5) {
    iVar7 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar7;
  }
  local_4c = type;
  local_48 = public_key_len;
  if (exchange_state->state == libssh2_NB_state_idle) {
    pBVar11 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar11;
    exchange_state->state = libssh2_NB_state_created;
  }
  iVar7 = 0;
  if (exchange_state->state == libssh2_NB_state_created) {
    local_68 = data + 1;
    hash = (EVP_MD_CTX *)data;
    local_60 = data_len;
    iVar7 = _libssh2_copy_string
                      (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
    if (iVar7 == 0) {
      session->server_hostkey_len = (uint32_t)server_public_key_len;
      iVar7 = _libssh2_md5_init((EVP_MD_CTX **)&server_public_key);
      if (iVar7 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         session->server_hostkey,(ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                        session->server_hostkey_md5,(uint *)0x0);
        EVP_MD_CTX_free(CONCAT44(server_public_key._4_4_,(int)server_public_key));
      }
      session->server_hostkey_md5_valid = (uint)(iVar7 != 0);
      iVar7 = _libssh2_sha1_init((EVP_MD_CTX **)&server_public_key);
      if (iVar7 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         session->server_hostkey,(ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                        session->server_hostkey_sha1,(uint *)0x0);
        EVP_MD_CTX_free(CONCAT44(server_public_key._4_4_,(int)server_public_key));
      }
      session->server_hostkey_sha1_valid = (uint)(iVar7 != 0);
      iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&server_public_key);
      if (iVar7 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         session->server_hostkey,(ulong)session->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                        session->server_hostkey_sha256,(uint *)0x0);
        EVP_MD_CTX_free(CONCAT44(server_public_key._4_4_,(int)server_public_key));
      }
      session->server_hostkey_sha256_valid = (uint)(iVar7 != 0);
      iVar7 = (*session->hostkey->init)
                        (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                         &session->server_hostkey_abstract);
      if (iVar7 != 0) {
        pcVar15 = "Unable to initialize hostkey importer ECDH";
LAB_001167ab:
        iVar7 = -10;
        goto LAB_001167e0;
      }
      iVar7 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      if (iVar7 != 0) {
        pcVar15 = "Unexpected key length ECDH";
        iVar7 = -0xe;
        goto LAB_001167e0;
      }
      iVar7 = _libssh2_get_string((string_buf *)&hash,&exchange_state->h_sig,
                                  &exchange_state->h_sig_len);
      if (iVar7 != 0) {
        pcVar15 = "Unexpected ECDH server sig length";
        goto LAB_001167ab;
      }
      iVar7 = _libssh2_ecdh_gen_k(&exchange_state->k,private_key,
                                  (uchar *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                  CONCAT44(server_public_key_len._4_4_,
                                           (uint32_t)server_public_key_len));
      if (iVar7 != 0) {
        pcVar15 = "Unable to create ECDH shared secret";
        iVar7 = -5;
        goto LAB_001167e0;
      }
      iVar8 = BN_num_bits((BIGNUM *)exchange_state->k);
      iVar7 = iVar8 + 0xe;
      if (-1 < iVar8 + 7) {
        iVar7 = iVar8 + 7;
      }
      exchange_state->k_value_len = (long)((iVar7 >> 3) + 5);
      uVar9 = BN_num_bits((BIGNUM *)exchange_state->k);
      if ((uVar9 & 7) != 0) {
        exchange_state->k_value_len = exchange_state->k_value_len - 1;
      }
      puVar12 = (uchar *)(*session->alloc)(exchange_state->k_value_len,&session->abstract);
      exchange_state->k_value = puVar12;
      if (puVar12 == (uchar *)0x0) {
        pcVar15 = "Unable to allocate buffer for ECDH K";
        goto LAB_00116673;
      }
      _libssh2_htonu32(puVar12,(int)exchange_state->k_value_len - 4);
      uVar9 = BN_num_bits((BIGNUM *)exchange_state->k);
      lVar18 = 4;
      if ((uVar9 & 7) == 0) {
        exchange_state->k_value[4] = '\0';
        lVar18 = 5;
      }
      BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + lVar18);
      if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
        exchange_state->exchange_hash = &ctx;
        _libssh2_sha512_init(&ctx);
        puVar13 = (session->local).banner;
        puVar12 = exchange_state->h_sig_comp;
        if (puVar13 == (uchar *)0x0) {
          _libssh2_htonu32(puVar12,0x16);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          pcVar15 = "SSH-2.0-libssh2_1.11.0";
          sVar21 = 0x16;
          pEVar19 = (EVP_MD_CTX *)ctx;
        }
        else {
          sVar21 = strlen((char *)puVar13);
          _libssh2_htonu32(puVar12,(int)sVar21 - 2);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          local_38 = (EVP_MD_CTX *)ctx;
          pcVar15 = (char *)(session->local).banner;
          sVar21 = strlen(pcVar15);
          sVar21 = sVar21 - 2;
          pEVar19 = local_38;
        }
        EVP_DigestUpdate(pEVar19,pcVar15,sVar21);
        sVar21 = strlen((char *)(session->remote).banner);
        _libssh2_htonu32(puVar12,(uint32_t)sVar21);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
        local_38 = (EVP_MD_CTX *)ctx;
        puVar13 = (session->remote).banner;
        sVar21 = strlen((char *)puVar13);
        EVP_DigestUpdate(local_38,puVar13,sVar21);
        _libssh2_htonu32(puVar12,(uint32_t)(session->local).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->local).kexinit,(session->local).kexinit_len);
        _libssh2_htonu32(puVar12,(uint32_t)(session->remote).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->remote).kexinit,(session->remote).kexinit_len);
        _libssh2_htonu32(puVar12,session->server_hostkey_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,session->server_hostkey,
                         (ulong)session->server_hostkey_len);
        sVar22 = local_48;
        _libssh2_htonu32(puVar12,(uint32_t)local_48);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,public_key,sVar22);
        _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,
                         (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,exchange_state->k_value,exchange_state->k_value_len);
        EVP_DigestFinal((EVP_MD_CTX *)ctx,puVar12,(uint *)0x0);
        EVP_MD_CTX_free(ctx);
        pLVar14 = session->hostkey;
        puVar12 = exchange_state->h_sig;
        sVar22 = exchange_state->h_sig_len;
        sVar20 = 0x40;
LAB_00118608:
        iVar7 = (*pLVar14->sig_verify)
                          (session,puVar12,sVar22,exchange_state->h_sig_comp,sVar20,
                           &session->server_hostkey_abstract);
        iVar7 = -(uint)(iVar7 != 0);
      }
      else {
        if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
          exchange_state->exchange_hash = &ctx;
          _libssh2_sha384_init(&ctx);
          puVar13 = (session->local).banner;
          puVar12 = exchange_state->h_sig_comp;
          if (puVar13 == (uchar *)0x0) {
            _libssh2_htonu32(puVar12,0x16);
            EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
            pcVar15 = "SSH-2.0-libssh2_1.11.0";
            sVar21 = 0x16;
            pEVar19 = (EVP_MD_CTX *)ctx;
          }
          else {
            sVar21 = strlen((char *)puVar13);
            _libssh2_htonu32(puVar12,(int)sVar21 - 2);
            EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
            local_38 = (EVP_MD_CTX *)ctx;
            pcVar15 = (char *)(session->local).banner;
            sVar21 = strlen(pcVar15);
            sVar21 = sVar21 - 2;
            pEVar19 = local_38;
          }
          EVP_DigestUpdate(pEVar19,pcVar15,sVar21);
          sVar21 = strlen((char *)(session->remote).banner);
          _libssh2_htonu32(puVar12,(uint32_t)sVar21);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          local_38 = (EVP_MD_CTX *)ctx;
          puVar13 = (session->remote).banner;
          sVar21 = strlen((char *)puVar13);
          EVP_DigestUpdate(local_38,puVar13,sVar21);
          _libssh2_htonu32(puVar12,(uint32_t)(session->local).kexinit_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->local).kexinit,(session->local).kexinit_len);
          _libssh2_htonu32(puVar12,(uint32_t)(session->remote).kexinit_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->remote).kexinit,(session->remote).kexinit_len
                          );
          _libssh2_htonu32(puVar12,session->server_hostkey_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len);
          sVar22 = local_48;
          _libssh2_htonu32(puVar12,(uint32_t)local_48);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,public_key,sVar22);
          _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,
                           (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                           CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestFinal((EVP_MD_CTX *)ctx,puVar12,(uint *)0x0);
          EVP_MD_CTX_free(ctx);
          pLVar14 = session->hostkey;
          puVar12 = exchange_state->h_sig;
          sVar22 = exchange_state->h_sig_len;
          sVar20 = 0x30;
          goto LAB_00118608;
        }
        iVar7 = 0;
        if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
          exchange_state->exchange_hash = &ctx;
          _libssh2_sha256_init(&ctx);
          puVar13 = (session->local).banner;
          puVar12 = exchange_state->h_sig_comp;
          if (puVar13 == (uchar *)0x0) {
            _libssh2_htonu32(puVar12,0x16);
            EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
            pcVar15 = "SSH-2.0-libssh2_1.11.0";
            sVar21 = 0x16;
            pEVar19 = (EVP_MD_CTX *)ctx;
          }
          else {
            sVar21 = strlen((char *)puVar13);
            _libssh2_htonu32(puVar12,(int)sVar21 - 2);
            EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
            local_38 = (EVP_MD_CTX *)ctx;
            pcVar15 = (char *)(session->local).banner;
            sVar21 = strlen(pcVar15);
            sVar21 = sVar21 - 2;
            pEVar19 = local_38;
          }
          EVP_DigestUpdate(pEVar19,pcVar15,sVar21);
          sVar21 = strlen((char *)(session->remote).banner);
          _libssh2_htonu32(puVar12,(uint32_t)sVar21);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          local_38 = (EVP_MD_CTX *)ctx;
          puVar13 = (session->remote).banner;
          sVar21 = strlen((char *)puVar13);
          EVP_DigestUpdate(local_38,puVar13,sVar21);
          _libssh2_htonu32(puVar12,(uint32_t)(session->local).kexinit_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->local).kexinit,(session->local).kexinit_len);
          _libssh2_htonu32(puVar12,(uint32_t)(session->remote).kexinit_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,(session->remote).kexinit,(session->remote).kexinit_len
                          );
          _libssh2_htonu32(puVar12,session->server_hostkey_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len);
          sVar22 = local_48;
          _libssh2_htonu32(puVar12,(uint32_t)local_48);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,public_key,sVar22);
          _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar12,4);
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,
                           (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                           CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
          EVP_DigestUpdate((EVP_MD_CTX *)ctx,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestFinal((EVP_MD_CTX *)ctx,puVar12,(uint *)0x0);
          EVP_MD_CTX_free(ctx);
          pLVar14 = session->hostkey;
          puVar12 = exchange_state->h_sig;
          sVar22 = exchange_state->h_sig_len;
          sVar20 = 0x20;
          goto LAB_00118608;
        }
      }
      if (iVar7 != 0) {
        pcVar15 = "Unable to verify hostkey signature ECDH";
        iVar7 = -0xb;
        goto LAB_001167e0;
      }
      exchange_state->c = '\x15';
      exchange_state->state = libssh2_NB_state_sent;
      bVar6 = true;
      iVar7 = 0;
    }
    else {
      pcVar15 = "Unable to allocate memory for a copy of the host ECDH key";
LAB_00116673:
      iVar7 = -6;
LAB_001167e0:
      iVar7 = _libssh2_error(session,iVar7,pcVar15);
      bVar6 = false;
    }
    if (!bVar6) goto LAB_001168aa;
  }
  if (exchange_state->state == libssh2_NB_state_sent) {
    iVar8 = _libssh2_transport_send(session,&exchange_state->c,1,(uchar *)0x0,0);
    if (iVar8 == -0x25) {
      return -0x25;
    }
    if (iVar8 == 0) {
      exchange_state->state = libssh2_NB_state_sent2;
      goto LAB_0011682a;
    }
    pcVar15 = "Unable to send NEWKEYS message ECDH";
LAB_0011689c:
    iVar7 = _libssh2_error(session,iVar8,pcVar15);
    goto LAB_001168aa;
  }
LAB_0011682a:
  if (exchange_state->state != libssh2_NB_state_sent2) goto LAB_001168aa;
  iVar8 = _libssh2_packet_require
                    (session,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,(uchar *)0x0,0,
                     &exchange_state->req_state);
  if (iVar8 == -0x25) {
    return -0x25;
  }
  if (iVar8 != 0) {
    pcVar15 = "Timed out waiting for NEWKEYS ECDH";
    goto LAB_0011689c;
  }
  *(byte *)&session->state = (byte)session->state | 2;
  (*session->free)(exchange_state->tmp,&session->abstract);
  iVar8 = iVar7;
  if (session->session_id == (uchar *)0x0) {
    if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
      sVar22 = 0x20;
LAB_00116987:
      puVar12 = (uchar *)(*session->alloc)(sVar22,&session->abstract);
      session->session_id = puVar12;
      if (puVar12 == (uchar *)0x0) {
        pcVar15 = "Unable to allocate buffer for SHA digest";
        iVar7 = -6;
        goto LAB_001169d8;
      }
      memcpy(puVar12,exchange_state->h_sig_comp,sVar22);
      session->session_id_len = (uint32_t)sVar22;
      bVar6 = true;
    }
    else {
      if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
        sVar22 = 0x40;
        goto LAB_00116987;
      }
      if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
        sVar22 = 0x30;
        goto LAB_00116987;
      }
      pcVar15 = "Unknown SHA digest for EC curve";
      iVar7 = -5;
LAB_001169d8:
      iVar7 = _libssh2_error(session,iVar7,pcVar15);
      bVar6 = false;
    }
    iVar8 = iVar7;
    if (!bVar6) goto LAB_001168aa;
  }
  p_Var1 = ((session->local).crypt)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->local).crypt_abstract);
  }
  pLVar2 = (session->local).crypt;
  if (pLVar2->init !=
      (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
       *)0x0) {
    local_48 = CONCAT44(local_48._4_4_,iVar8);
    server_public_key._0_4_ = 0;
    server_public_key_len._0_4_ = 0;
    if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
      puVar12 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x20,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->local).crypt)->iv_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha256_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x20);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x20;
        } while (sVar21 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar12 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x40,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->local).crypt)->iv_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha512_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x40);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x40;
        } while (sVar21 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar12 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x30,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->local).crypt)->iv_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha384_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x30);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x30;
        } while (sVar21 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else {
      puVar12 = (uchar *)0x0;
    }
    if (puVar12 == (uchar *)0x0) {
      iVar8 = -1;
      bVar6 = false;
    }
    else {
      if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
        puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x20,
                                             &session->abstract);
        if ((puVar13 != (uchar *)0x0) && (((session->local).crypt)->secret_len != 0)) {
          sVar21 = 0;
          do {
            _libssh2_sha256_init(&hash);
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len)
            ;
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x20);
            uVar16 = sVar21;
            puVar17 = puVar13;
            if (sVar21 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
              uVar16 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar21,(uint *)0x0);
            EVP_MD_CTX_free(hash);
            sVar21 = sVar21 + 0x20;
          } while (sVar21 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
        puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x40,
                                             &session->abstract);
        if ((puVar13 != (uchar *)0x0) && (((session->local).crypt)->secret_len != 0)) {
          sVar21 = 0;
          do {
            _libssh2_sha512_init(&hash);
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len)
            ;
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x40);
            uVar16 = sVar21;
            puVar17 = puVar13;
            if (sVar21 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
              uVar16 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar21,(uint *)0x0);
            EVP_MD_CTX_free(hash);
            sVar21 = sVar21 + 0x40;
          } while (sVar21 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
        puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x30,
                                             &session->abstract);
        if ((puVar13 != (uchar *)0x0) && (((session->local).crypt)->secret_len != 0)) {
          sVar21 = 0;
          do {
            _libssh2_sha384_init(&hash);
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len)
            ;
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x30);
            uVar16 = sVar21;
            puVar17 = puVar13;
            if (sVar21 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
              uVar16 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar21,(uint *)0x0);
            EVP_MD_CTX_free(hash);
            sVar21 = sVar21 + 0x30;
          } while (sVar21 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else {
        puVar13 = (uchar *)0x0;
      }
      iVar8 = -5;
      if (puVar13 == (uchar *)0x0) {
        bVar6 = false;
      }
      else {
        pLVar2 = (session->local).crypt;
        iVar7 = (*pLVar2->init)(session,pLVar2,puVar12,(int *)&server_public_key,puVar13,
                                (int *)&server_public_key_len,1,&(session->local).crypt_abstract);
        if (iVar7 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar12,(long)((session->local).crypt)->iv_len);
            (*session->free)(puVar12,&session->abstract);
          }
          if ((uint32_t)server_public_key_len == 0) {
            bVar6 = true;
            iVar8 = (int)local_48;
            goto LAB_00117059;
          }
          explicit_bzero(puVar13,(long)((session->local).crypt)->secret_len);
          bVar6 = true;
          puVar12 = puVar13;
          iVar8 = (int)local_48;
        }
        else {
          (*session->free)(puVar12,&session->abstract);
          bVar6 = false;
          puVar12 = puVar13;
        }
      }
      (*session->free)(puVar12,&session->abstract);
    }
LAB_00117059:
    iVar7 = iVar8;
    if (!bVar6) goto LAB_001168aa;
  }
  p_Var1 = ((session->remote).crypt)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->remote).crypt_abstract);
  }
  pLVar2 = (session->remote).crypt;
  if (pLVar2->init !=
      (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
       *)0x0) {
    local_48 = CONCAT44(local_48._4_4_,iVar8);
    server_public_key._0_4_ = 0;
    server_public_key_len._0_4_ = 0;
    if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
      puVar12 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x20,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->remote).crypt)->iv_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha256_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x20);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x20;
        } while (sVar21 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar12 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x40,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->remote).crypt)->iv_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha512_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x40);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x40;
        } while (sVar21 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar12 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x30,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->remote).crypt)->iv_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha384_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x30);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x30;
        } while (sVar21 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else {
      puVar12 = (uchar *)0x0;
    }
    if (puVar12 == (uchar *)0x0) {
      iVar8 = -5;
      bVar6 = false;
    }
    else {
      if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
        puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len + 0x20,
                                             &session->abstract);
        if ((puVar13 != (uchar *)0x0) && (((session->remote).crypt)->secret_len != 0)) {
          sVar21 = 0;
          do {
            _libssh2_sha256_init(&hash);
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len)
            ;
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x20);
            uVar16 = sVar21;
            puVar17 = puVar13;
            if (sVar21 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
              uVar16 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar21,(uint *)0x0);
            EVP_MD_CTX_free(hash);
            sVar21 = sVar21 + 0x20;
          } while (sVar21 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
        puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len + 0x40,
                                             &session->abstract);
        if ((puVar13 != (uchar *)0x0) && (((session->remote).crypt)->secret_len != 0)) {
          sVar21 = 0;
          do {
            _libssh2_sha512_init(&hash);
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len)
            ;
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x40);
            uVar16 = sVar21;
            puVar17 = puVar13;
            if (sVar21 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
              uVar16 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar21,(uint *)0x0);
            EVP_MD_CTX_free(hash);
            sVar21 = sVar21 + 0x40;
          } while (sVar21 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
        puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len + 0x30,
                                             &session->abstract);
        if ((puVar13 != (uchar *)0x0) && (((session->remote).crypt)->secret_len != 0)) {
          sVar21 = 0;
          do {
            _libssh2_sha384_init(&hash);
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len)
            ;
            EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x30);
            uVar16 = sVar21;
            puVar17 = puVar13;
            if (sVar21 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
              uVar16 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
            EVP_DigestFinal((EVP_MD_CTX *)hash,puVar13 + sVar21,(uint *)0x0);
            EVP_MD_CTX_free(hash);
            sVar21 = sVar21 + 0x30;
          } while (sVar21 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else {
        puVar13 = (uchar *)0x0;
      }
      iVar8 = -5;
      if (puVar13 == (uchar *)0x0) {
        bVar6 = false;
      }
      else {
        pLVar2 = (session->remote).crypt;
        iVar7 = (*pLVar2->init)(session,pLVar2,puVar12,(int *)&server_public_key,puVar13,
                                (int *)&server_public_key_len,0,&(session->remote).crypt_abstract);
        if (iVar7 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar12,(long)((session->remote).crypt)->iv_len);
            (*session->free)(puVar12,&session->abstract);
          }
          if ((uint32_t)server_public_key_len == 0) {
            bVar6 = true;
            iVar8 = (int)local_48;
            goto LAB_0011780b;
          }
          explicit_bzero(puVar13,(long)((session->remote).crypt)->secret_len);
          bVar6 = true;
          puVar12 = puVar13;
          iVar8 = (int)local_48;
        }
        else {
          (*session->free)(puVar12,&session->abstract);
          bVar6 = false;
          puVar12 = puVar13;
        }
      }
      (*session->free)(puVar12,&session->abstract);
    }
LAB_0011780b:
    iVar7 = iVar8;
    if (!bVar6) goto LAB_001168aa;
  }
  p_Var1 = ((session->local).mac)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->local).mac_abstract);
  }
  p_Var3 = (session->local).mac;
  if (p_Var3->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
    local_48 = CONCAT44(local_48._4_4_,iVar8);
    server_public_key._0_4_ = 0;
    if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar12 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x40,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->local).mac)->key_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha512_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x40);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x40;
        } while (sVar21 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar12 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x30,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->local).mac)->key_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha384_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x30);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x30;
        } while (sVar21 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
      puVar12 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x20,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->local).mac)->key_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha256_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x20);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x20;
        } while (sVar21 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else {
      puVar12 = (uchar *)0x0;
    }
    if (puVar12 == (uchar *)0x0) {
      iVar8 = -5;
    }
    else {
      (*((session->local).mac)->init)
                (session,puVar12,(int *)&server_public_key,&(session->local).mac_abstract);
      if ((int)server_public_key != 0) {
        explicit_bzero(puVar12,(long)((session->local).mac)->key_len);
        (*session->free)(puVar12,&session->abstract);
      }
      iVar8 = (int)local_48;
    }
    iVar7 = iVar8;
    if (puVar12 == (uchar *)0x0) goto LAB_001168aa;
  }
  p_Var1 = ((session->remote).mac)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->remote).mac_abstract);
  }
  p_Var3 = (session->remote).mac;
  if (p_Var3->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
    local_48 = CONCAT44(local_48._4_4_,iVar8);
    server_public_key._0_4_ = 0;
    if (local_4c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar12 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x40,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->remote).mac)->key_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha512_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x40);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x40;
        } while (sVar21 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar12 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x30,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->remote).mac)->key_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha384_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x30);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x30;
        } while (sVar21 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else if (local_4c == LIBSSH2_EC_CURVE_NISTP256) {
      puVar12 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x20,&session->abstract);
      if ((puVar12 != (uchar *)0x0) && (((session->remote).mac)->key_len != 0)) {
        sVar21 = 0;
        do {
          _libssh2_sha256_init(&hash);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,exchange_state->k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x20);
          uVar16 = sVar21;
          puVar13 = puVar12;
          if (sVar21 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
            uVar16 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar13,uVar16);
          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + sVar21,(uint *)0x0);
          EVP_MD_CTX_free(hash);
          sVar21 = sVar21 + 0x20;
        } while (sVar21 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else {
      puVar12 = (uchar *)0x0;
    }
    if (puVar12 == (uchar *)0x0) {
      iVar8 = -5;
    }
    else {
      (*((session->remote).mac)->init)
                (session,puVar12,(int *)&server_public_key,&(session->remote).mac_abstract);
      if ((int)server_public_key != 0) {
        explicit_bzero(puVar12,(long)((session->remote).mac)->key_len);
        (*session->free)(puVar12,&session->abstract);
      }
      iVar8 = (int)local_48;
    }
    iVar7 = iVar8;
    if (puVar12 == (uchar *)0x0) goto LAB_001168aa;
  }
  pLVar4 = (session->local).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->dtor, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    (*p_Var5)(session,1,&(session->local).comp_abstract);
  }
  pLVar4 = (session->local).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->init, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    iVar10 = (*p_Var5)(session,1,&(session->local).comp_abstract);
    iVar7 = -5;
    if (iVar10 != 0) goto LAB_001168aa;
  }
  pLVar4 = (session->remote).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->dtor, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    (*p_Var5)(session,0,&(session->remote).comp_abstract);
  }
  pLVar4 = (session->remote).comp;
  iVar7 = iVar8;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->init, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    iVar10 = (*p_Var5)(session,0,&(session->remote).comp_abstract);
    iVar7 = -5;
    if (iVar10 == 0) {
      iVar7 = iVar8;
    }
  }
LAB_001168aa:
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  if (exchange_state->k_value != (uchar *)0x0) {
    (*session->free)(exchange_state->k_value,&session->abstract);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return iVar7;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx)) {
                libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len);
                libssh2_md5_final(fingerprint_ctx,
                                  session->server_hostkey_md5);
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx)) {
                libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                    session->server_hostkey_len);
                libssh2_sha1_final(fingerprint_ctx,
                                   session->server_hostkey_sha1);
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx)) {
                libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                      session->server_hostkey_len);
                libssh2_sha256_final(fingerprint_ctx,
                                     session->server_hostkey_sha256);
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        }
        else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;

            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}